

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

void __thiscall
DomStringPropertySpecification::~DomStringPropertySpecification
          (DomStringPropertySpecification *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->m_attr_notr).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_attr_notr).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->m_attr_type).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_attr_type).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->m_attr_name).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&((this->m_attr_name).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

DomStringPropertySpecification::~DomStringPropertySpecification() = default;